

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

double getOpResult(OPCODE op,char *a,char *b)

{
  _Bool _Var1;
  long lVar2;
  double dVar3;
  double local_38;
  double y;
  double x;
  char *b_local;
  char *a_local;
  double dStack_10;
  OPCODE op_local;
  
  inside_def = op == OP_Equal;
  if (inside_def) {
    dVar3 = getValue(b);
    addVariable(a,dVar3);
    dStack_10 = 0.0;
  }
  else {
    y = getValue(a);
    local_38 = getValue(b);
    if (-1 < precision) {
      y = round_(y,(long)precision);
      local_38 = round_(local_38,(long)precision);
    }
    if (op == OP_Plus) {
      dStack_10 = y + local_38;
    }
    else if (op == OP_Minus) {
      dStack_10 = y - local_38;
    }
    else if (op == OP_Multi) {
      dStack_10 = y * local_38;
    }
    else if (op == OP_Div) {
      if ((local_38 != 0.0) || (NAN(local_38))) {
        dStack_10 = y / local_38;
      }
      else {
        division_warning = true;
        dStack_10 = 0.0;
      }
    }
    else if (op == OP_Pow) {
      dStack_10 = pow(y,local_38);
    }
    else if (op == OP_Fact) {
      lVar2 = fact((long)(int)local_38);
      dStack_10 = (double)lVar2;
    }
    else if (op == OP_Sqrt) {
      dStack_10 = sqrt(local_38);
    }
    else if (op == OP_Abs) {
      dStack_10 = ABS(local_38);
    }
    else if (op == OP_Log) {
      dStack_10 = log(local_38);
    }
    else if (op == OP_Floor) {
      dStack_10 = floor(local_38);
    }
    else if (op == OP_Ceil) {
      dStack_10 = ceil(local_38);
    }
    else if (op == OP_Round) {
      dStack_10 = round(local_38);
    }
    else if (op == OP_Rand) {
      dStack_10 = getRand();
    }
    else if (op == OP_Mb) {
      dStack_10 = local_38 * 1024.0;
    }
    else if (op == OP_Gb) {
      dStack_10 = local_38 * 1024.0 * 1024.0;
    }
    else if (op == OP_Tb) {
      dStack_10 = local_38 * 1024.0 * 1024.0 * 1024.0;
    }
    else if (op == OP_Pb) {
      dStack_10 = local_38 * 1024.0 * 1024.0 * 1024.0 * 1024.0;
    }
    else {
      if (((degree & 1U) != 0) && (_Var1 = isTrigonometric(op), _Var1)) {
        dVar3 = acos(-1.0);
        local_38 = (local_38 / 180.0) * dVar3;
      }
      if (op == OP_Sin) {
        dStack_10 = sin(local_38);
      }
      else if (op == OP_Cos) {
        dStack_10 = cos(local_38);
      }
      else if (op == OP_Tan) {
        dStack_10 = tan(local_38);
      }
      else if ((((op != OP_Asin) && (op != OP_Acos)) && (op != OP_Atan)) ||
              ((-1.0 <= local_38 && (local_38 <= 1.0)))) {
        if (op == OP_Asin) {
          dStack_10 = asin(local_38);
        }
        else if (op == OP_Acos) {
          dStack_10 = acos(local_38);
        }
        else if (op == OP_Atan) {
          dStack_10 = atan(local_38);
        }
        else {
          dStack_10 = 0.0;
        }
      }
      else {
        trigonometric_warning = true;
        dStack_10 = 0.0;
      }
    }
  }
  return dStack_10;
}

Assistant:

static double getOpResult(enum OPCODE op, const char *a, const char *b)
{
    double x, y;

    inside_def = op == OP_Equal;
    if (inside_def) {
        addVariable(a, getValue(b));
        return 0;
    }

    x = getValue(a);
    y = getValue(b);

    if (precision >= 0) {
        x = round_(x, precision);
        y = round_(y, precision);
    }

    if (op == OP_Plus) {
        return x + y;
    }

    if (op == OP_Minus) {
        return x - y;
    }

    if (op == OP_Multi) {
        return x * y;
    }

    if (op == OP_Div) {
        if (y == 0) {
            division_warning = true;
            return 0;
        }

        return x / y;
    }

    if (op == OP_Pow) {
        return pow(x, y);
    }

    if (op == OP_Fact) {
        return fact((int)y);
    }

    if (op == OP_Sqrt) {
        return sqrt(y);
    }

    if (op == OP_Abs) {
        return fabs(y);
    }

    if (op == OP_Log) {
        return log(y);
    }

    if (op == OP_Floor) {
        return floor(y);
    }

    if (op == OP_Ceil) {
        return ceil(y);
    }

    if (op == OP_Round) {
        return round(y);
    }

    if (op == OP_Rand) {
        return getRand();
    }

    if (op == OP_Mb) {
        return y * ONE_MB;
    }

    if (op == OP_Gb) {
        return y * ONE_GB;
    }

    if (op == OP_Tb) {
        return y * ONE_TB;
    }

    if (op == OP_Pb) {
        return y * ONE_PT;
    }

    if (degree && isTrigonometric(op)) {
        y = y / 180 * MATH_PI;
    }

    if (op == OP_Sin) {
        return sin(y);
    }

    if (op == OP_Cos) {
        return cos(y);
    }

    if (op == OP_Tan) {
        return tan(y);
    }

    if ((op == OP_Asin ||
        op == OP_Acos ||
        op == OP_Atan) &&
        (y < -1 || y > 1)) {
        trigonometric_warning = true;
        return 0;
    }

    if (op == OP_Asin) {
        return asin(y);
    }

    if (op == OP_Acos) {
        return acos(y);
    }

    if (op == OP_Atan) {
        return atan(y);
    }

    return 0;
}